

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_esis.c
# Opt level: O2

void append(int *arr_sz,int *reserved_sz,uint32_t **arr,uint32_t val)

{
  uint32_t *__ptr;
  int iVar1;
  
  iVar1 = *arr_sz;
  __ptr = *arr;
  if (iVar1 == *reserved_sz) {
    *reserved_sz = iVar1 * 2;
    __ptr = (uint32_t *)realloc(__ptr,(long)iVar1 << 3);
    *arr = __ptr;
    iVar1 = *arr_sz;
  }
  *arr_sz = iVar1 + 1;
  __ptr[iVar1] = val;
  return;
}

Assistant:

static void append(int* arr_sz,
		int* reserved_sz,
		uint32_t** arr,
		uint32_t val)
{
	if (*arr_sz == *reserved_sz) {
		*reserved_sz *= 2;
		*arr = realloc(*arr,
			*reserved_sz * sizeof(**arr));
	}
	(*arr)[(*arr_sz)++] = val;
}